

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O0

int rtosc_subpath_pat_type(char *pattern)

{
  _Bool _Var1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  uint8_t *in_RDI;
  char *p;
  char *pound;
  char *last_star;
  int charwise_only;
  uint8_t *local_30;
  int local_4;
  
  bVar2 = 1;
  pcVar4 = strrchr((char *)in_RDI,0x2a);
  pcVar5 = strchr((char *)in_RDI,0x23);
  iVar3 = strcmp("*",(char *)in_RDI);
  local_30 = in_RDI;
  if (iVar3 == 0) {
    local_4 = 1;
  }
  else {
    for (; *local_30 != '\0'; local_30 = local_30 + 1) {
      _Var1 = is_charwise(*local_30);
      bVar2 = _Var1 & bVar2;
    }
    if ((bVar2 == 0) || (pcVar4 != (char *)0x0)) {
      if (pcVar5 == (char *)0x0) {
        local_4 = 2;
      }
      else {
        local_4 = 7;
      }
    }
    else {
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

int rtosc_subpath_pat_type(const char *pattern)
{
    int charwise_only = 1;
    const char *last_star = strrchr(pattern, '*');
    const char *pound = strchr(pattern, '#');
    if(!strcmp("*", pattern))
        return RTOSC_MATCH_ALL;

    for(const char *p = pattern;*p;++p)
        charwise_only &= is_charwise(*p);
    if(charwise_only && !last_star)
        return RTOSC_MATCH_CHAR;
    if(pound)
        return RTOSC_MATCH_ENUMERATED;


    return 2;
}